

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::MultiDrawIndexed
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,MultiDrawIndexedAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  PRIMITIVE_TOPOLOGY Topology;
  PipelineStateGLImpl *pPVar3;
  bool bVar4;
  Uint32 UVar5;
  GraphicsPipelineDesc *pGVar6;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char *in_R8;
  char (*in_R9) [8];
  long lVar7;
  ulong uVar8;
  string msg;
  string local_68;
  String local_48;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_68,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x992);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      FormatString<char[97]>
                (&local_68,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      Type = extraout_DL;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        Type = extraout_DL_00;
      }
    }
    CVar2 = (this->m_Desc).QueueType;
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&local_68,(Diligent *)"MultiDrawIndexed",(char (*) [17])0x917e3a,
                 (char (*) [22])&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_pPipelineState).m_pObject == (PipelineStateGLImpl *)0x0) {
      FormatString<char[76]>
                (&local_68,
                 (char (*) [76])
                 "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x994);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    pPVar3 = (this->m_pPipelineState).m_pObject;
    PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
              (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if ((pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar3 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
                (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[65],char_const*,char[30]>
                (&local_68,
                 (Diligent *)"MultiDrawIndexed command arguments are invalid: pipeline state \'",
                 (char (*) [65])
                 &(pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x998);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_pIndexBuffer).m_pObject == (BufferGLImpl *)0x0) {
      FormatString<char[74]>
                (&local_68,
                 (char (*) [74])
                 "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    bVar4 = VerifyMultiDrawIndexedAttribs(Attribs);
    if (!bVar4) {
      FormatString<char[36]>(&local_68,(char (*) [36])"MultiDrawIndexedAttribs are invalid");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pPVar3 = (this->m_pPipelineState).m_pObject;
  if (pPVar3 != (PipelineStateGLImpl *)0x0) {
    pGVar6 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (Attribs->DrawCount != 0) {
      Topology = pGVar6->PrimitiveTopology;
      lVar7 = 0;
      uVar8 = 0;
      do {
        UVar5 = GetPrimitiveCount(Topology,*(Uint32 *)
                                            ((long)&Attribs->pDrawItems->NumIndices + lVar7));
        pUVar1 = (this->m_Stats).PrimitiveCounts + Topology;
        *pUVar1 = *pUVar1 + UVar5;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 < Attribs->DrawCount);
    }
  }
  UVar5 = 1;
  if (this->m_NativeMultiDrawSupported == false) {
    UVar5 = Attribs->DrawCount;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawIndexed +
           (ulong)this->m_NativeMultiDrawSupported * 4;
  *pUVar1 = *pUVar1 + UVar5;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MultiDrawIndexed(const MultiDrawIndexedAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "MultiDrawIndexed");

        DEV_CHECK_ERR(m_pPipelineState, "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "MultiDrawIndexed command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(VerifyMultiDrawIndexedAttribs(Attribs), "MultiDrawIndexedAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
            m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.pDrawItems[i].NumIndices);
    }
    if (m_NativeMultiDrawSupported)
        ++m_Stats.CommandCounters.MultiDrawIndexed;
    else
        m_Stats.CommandCounters.DrawIndexed += Attribs.DrawCount;
}